

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O2

session_params *
libtorrent::read_session_params
          (session_params *__return_storage_ptr__,bdecode_node *e,save_state_flags_t flags)

{
  bool bVar1;
  type_t tVar2;
  long lVar3;
  settings_pack *psVar4;
  dht_settings *pdVar5;
  byte bVar6;
  string_view key;
  string_view key_00;
  string_view key_01;
  bdecode_node settings;
  settings_pack local_70;
  
  bVar6 = 0;
  session_params::session_params(__return_storage_ptr__);
  settings._32_12_ = SUB1612((undefined1  [16])0x0,4);
  settings._16_12_ = SUB1612((undefined1  [16])0x0,0);
  settings.m_root_tokens._4_4_ = 0;
  settings.m_tokens.
  super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  .
  super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  settings.m_tokens.
  super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  .
  super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  settings.m_token_idx = -1;
  settings.m_last_index = -1;
  settings.m_last_token = -1;
  settings.m_size = -1;
  tVar2 = bdecode_node::type(e);
  if (tVar2 == dict_t) {
    if ((flags.m_val & 1) != 0) {
      key.len_ = 8;
      key.ptr_ = "settings";
      bdecode_node::dict_find_dict((bdecode_node *)&local_70,e,key);
      bdecode_node::operator=(&settings,(bdecode_node *)&local_70);
      std::
      _Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
      ::~_Vector_base((_Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                       *)&local_70);
      bVar1 = bdecode_node::operator_cast_to_bool(&settings);
      if (bVar1) {
        load_pack_from_dict(&local_70,&settings);
        settings_pack::operator=(&__return_storage_ptr__->settings,&local_70);
        settings_pack::~settings_pack(&local_70);
      }
    }
    if ((flags.m_val & 2) != 0) {
      key_00.len_ = 3;
      key_00.ptr_ = "dht";
      bdecode_node::dict_find_dict((bdecode_node *)&local_70,e,key_00);
      bdecode_node::operator=(&settings,(bdecode_node *)&local_70);
      std::
      _Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
      ::~_Vector_base((_Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                       *)&local_70);
      bVar1 = bdecode_node::operator_cast_to_bool(&settings);
      if (bVar1) {
        dht::read_dht_settings((dht_settings *)&local_70,&settings);
        psVar4 = &local_70;
        pdVar5 = &__return_storage_ptr__->dht_settings;
        for (lVar3 = 0x11; lVar3 != 0; lVar3 = lVar3 + -1) {
          pdVar5->max_peers_reply =
               *(int *)&(psVar4->m_strings).
                        super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          psVar4 = (settings_pack *)((long)psVar4 + ((ulong)bVar6 * -2 + 1) * 4);
          pdVar5 = (dht_settings *)((long)pdVar5 + (ulong)bVar6 * -8 + 4);
        }
      }
    }
    if ((flags.m_val & 4) != 0) {
      key_01.len_ = 9;
      key_01.ptr_ = "dht state";
      bdecode_node::dict_find_dict((bdecode_node *)&local_70,e,key_01);
      bdecode_node::operator=(&settings,(bdecode_node *)&local_70);
      std::
      _Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
      ::~_Vector_base((_Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                       *)&local_70);
      bVar1 = bdecode_node::operator_cast_to_bool(&settings);
      if (bVar1) {
        dht::read_dht_state((dht_state *)&local_70,&settings);
        dht::dht_state::operator=(&__return_storage_ptr__->dht_state,(dht_state *)&local_70);
        dht::dht_state::~dht_state((dht_state *)&local_70);
      }
    }
  }
  std::
  _Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  ::~_Vector_base((_Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                   *)&settings);
  return __return_storage_ptr__;
}

Assistant:

session_params read_session_params(bdecode_node const& e, save_state_flags_t const flags)
	{
		session_params params;

		bdecode_node settings;
		if (e.type() != bdecode_node::dict_t) return params;

		if (flags & session_handle::save_settings)
		{
			settings = e.dict_find_dict("settings");
			if (settings)
			{
				params.settings = load_pack_from_dict(settings);
			}
		}

#ifndef TORRENT_DISABLE_DHT
		if (flags & session_handle::save_dht_settings)
		{
			settings = e.dict_find_dict("dht");
			if (settings)
			{
				params.dht_settings = dht::read_dht_settings(settings);
			}
		}

		if (flags & session_handle::save_dht_state)
		{
			settings = e.dict_find_dict("dht state");
			if (settings)
			{
				params.dht_state = dht::read_dht_state(settings);
			}
		}
#endif

		return params;
	}